

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata160.cpp
# Opt level: O2

void __thiscall
ByteData160_DefaultConstructor_Test::TestBody(ByteData160_DefaultConstructor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_2;
  ByteData byte_class_data;
  AssertHelper local_30;
  ByteData160 byte_data;
  
  cfd::core::ByteData160::ByteData160(&byte_data);
  cfd::core::ByteData160::GetHex_abi_cxx11_((string *)&gtest_ar_3,&byte_data);
  testing::internal::CmpHelperSTREQ
            ((internal *)&byte_class_data,"byte_data.GetHex().c_str()",
             "\"0000000000000000000000000000000000000000\"",
             (char *)CONCAT71(gtest_ar_3._1_7_,gtest_ar_3.success_),
             "0000000000000000000000000000000000000000");
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  if ((char)byte_class_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (byte_class_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)byte_class_data.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata160.cpp"
               ,0x10,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&byte_class_data.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  byte_class_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = cfd::core::ByteData160::IsEmpty(&byte_data);
  byte_class_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)(char)byte_class_data.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3,(internal *)&byte_class_data,
               (AssertionResult *)"byte_data.IsEmpty()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata160.cpp"
               ,0x11,(char *)CONCAT71(gtest_ar_3._1_7_,gtest_ar_3.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    std::__cxx11::string::~string((string *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&byte_class_data.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  cfd::core::ByteData160::Serialize(&byte_class_data,&byte_data);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_3,&byte_class_data);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"byte_data.Serialize().GetHex().c_str()",
             "\"140000000000000000000000000000000000000000\"",
             (char *)CONCAT71(gtest_ar_3._1_7_,gtest_ar_3.success_),
             "140000000000000000000000000000000000000000");
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_class_data);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&byte_class_data,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata160.cpp"
               ,0x14,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&byte_class_data,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&byte_class_data);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::ByteData::ByteData(&byte_class_data);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ByteData160::GetData((ByteData *)&gtest_ar_3,&byte_data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&byte_class_data.data_,&gtest_ar_3);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_3);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata160.cpp"
               ,0x16,
               "Expected: byte_class_data = byte_data.GetData() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  cfd::core::ByteData160::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_3,&byte_data);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_1,&byte_class_data);
  testing::internal::
  CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((internal *)&gtest_ar_2,"byte_data.GetBytes()","byte_class_data.GetBytes()",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_3,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_3);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata160.cpp"
               ,0x17,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  bVar1 = cfd::core::ByteData160::Empty(&byte_data);
  gtest_ar_1.success_ = bVar1;
  gtest_ar_1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar_2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3,(internal *)&gtest_ar_1,(AssertionResult *)"byte_data.Empty()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata160.cpp"
               ,0x18,(char *)CONCAT71(gtest_ar_3._1_7_,gtest_ar_3.success_));
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    std::__cxx11::string::~string((string *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1.success_ = false;
  gtest_ar_1._1_3_ = 0;
  bVar1 = (bool)cfd::core::ByteData160::GetHeadData(&byte_data);
  gtest_ar_2.success_ = bVar1;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar_3,"0","byte_data.GetHeadData()",(int *)&gtest_ar_1,
             &gtest_ar_2.success_);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata160.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_3_ = 0;
  cfd::core::ByteData160::Serialize((ByteData *)&gtest_ar_3,&byte_data);
  local_30.data_._0_1_ = cfd::core::ByteData::GetHeadData((ByteData *)&gtest_ar_3);
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar_1,"0x14","byte_data.Serialize().GetHeadData()",(int *)&gtest_ar_2
             ,(uchar *)&local_30);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_3);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata160.cpp"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_class_data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data);
  return;
}

Assistant:

TEST(ByteData160, DefaultConstructor) {
  ByteData160 byte_data;

  EXPECT_STREQ(byte_data.GetHex().c_str(),
               "0000000000000000000000000000000000000000");
  EXPECT_TRUE(byte_data.IsEmpty());
  EXPECT_STREQ(
    byte_data.Serialize().GetHex().c_str(),
    "140000000000000000000000000000000000000000");
  ByteData byte_class_data;
  EXPECT_NO_THROW(byte_class_data = byte_data.GetData());
  EXPECT_EQ(byte_data.GetBytes(), byte_class_data.GetBytes());
  EXPECT_TRUE(byte_data.Empty());   // TODO(k-matsuzawa): deprecated API

  EXPECT_EQ(0, byte_data.GetHeadData());
  EXPECT_EQ(0x14, byte_data.Serialize().GetHeadData());
}